

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O2

MemoryLeakDetectorNode * __thiscall
MemoryLeakDetectorList::getLeakFrom
          (MemoryLeakDetectorList *this,MemoryLeakDetectorNode *node,MemLeakPeriod period)

{
  MemoryLeakDetectorNode *cur;
  
  while( true ) {
    if ((period == mem_leak_period_all) || (node == (MemoryLeakDetectorNode *)0x0)) {
      return node;
    }
    if (*(MemLeakPeriod *)(node + 0x30) == period) {
      return node;
    }
    if (period == mem_leak_period_enabled &&
        *(MemLeakPeriod *)(node + 0x30) != mem_leak_period_disabled) break;
    node = *(MemoryLeakDetectorNode **)(node + 0x38);
  }
  return node;
}

Assistant:

MemoryLeakDetectorNode* MemoryLeakDetectorList::getLeakFrom(MemoryLeakDetectorNode* node, MemLeakPeriod period)
{
    for (MemoryLeakDetectorNode* cur = node; cur; cur = cur->next_)
        if (isInPeriod(cur, period)) return cur;
    return NULLPTR;
}